

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O3

_Bool menu_action_handle(menu *m,ui_event *event,int oid)

{
  byte *pbVar1;
  _Bool _Var2;
  
  if (event->type == EVT_SELECT) {
    pbVar1 = (byte *)m->menu_data;
    if ((*pbVar1 & 1) == 0) {
      if (*(code **)(pbVar1 + (long)oid * 0x18 + 0x10) != (code *)0x0) {
        (**(code **)(pbVar1 + (long)oid * 0x18 + 0x10))
                  (*(undefined8 *)(pbVar1 + (long)oid * 0x18 + 8),m->cursor);
        return true;
      }
    }
  }
  else if (event->type == EVT_KBRD && m->keys_hook != (_func__Bool_menu_ptr_ui_event_ptr_int *)0x0)
  {
    _Var2 = (*m->keys_hook)(m,event,oid);
    return _Var2;
  }
  return false;
}

Assistant:

static bool menu_action_handle(struct menu *m, const ui_event *event, int oid)
{
	menu_action *acts = menu_priv(m);

	if (event->type == EVT_SELECT) {
		if (!(acts->flags & MN_ACT_GRAYED) && acts[oid].action) {
			acts[oid].action(acts[oid].name, m->cursor);
			return true;
		}
	} else if (m->keys_hook && event->type == EVT_KBRD) {
		return m->keys_hook(m, event, oid);
	}

	return false;
}